

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

void IDAQuadSensFree(void *ida_mem)

{
  IDAMem in_RDI;
  IDAMem IDA_mem;
  
  if (in_RDI != (IDAMem)0x0) {
    if (in_RDI->ida_quadSensMallocDone != 0) {
      IDAQuadSensFreeVectors(in_RDI);
      in_RDI->ida_quadSensMallocDone = 0;
      in_RDI->ida_quadr_sensi = 0;
    }
    if (in_RDI->ida_atolQSmin0 != (int *)0x0) {
      free(in_RDI->ida_atolQSmin0);
      in_RDI->ida_atolQSmin0 = (int *)0x0;
    }
  }
  return;
}

Assistant:

void IDAQuadSensFree(void* ida_mem)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL) { return; }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadSensMallocDone)
  {
    IDAQuadSensFreeVectors(IDA_mem);
    IDA_mem->ida_quadSensMallocDone = SUNFALSE;
    IDA_mem->ida_quadr_sensi        = SUNFALSE;
  }

  /* free min atol array if necessary */
  if (IDA_mem->ida_atolQSmin0)
  {
    free(IDA_mem->ida_atolQSmin0);
    IDA_mem->ida_atolQSmin0 = NULL;
  }
}